

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<long,(unsigned_char)2>,wabt::interp::Simd<int,(unsigned_char)4>,false>
          (Thread *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long alStack_48 [2];
  Simd<long,_(unsigned_char)__x02_> result;
  Simd<int,_(unsigned_char)__x04_> lhs;
  Simd<int,_(unsigned_char)__x04_> rhs;
  
  alStack_48[1] = 0x1bcbc7;
  rhs.v = (int  [4])Pop(this);
  alStack_48[1] = 0x1bcbd9;
  lhs.v = (int  [4])Pop(this);
  lVar1 = 2;
  lVar2 = 8;
  while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
    *(long *)((long)alStack_48 + lVar2 * 2) =
         (long)*(int *)((long)rhs.v + lVar2) * (long)*(int *)((long)lhs.v + lVar2);
    lVar2 = lVar2 + 4;
  }
  alStack_48[1] = 0x1bcc19;
  Push(this,(Value)result.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}